

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghsymbol.cc
# Opt level: O0

void __thiscall VarnodeListSymbol::checkTableFill(VarnodeListSymbol *this)

{
  int iVar1;
  int extraout_var;
  undefined4 extraout_var_00;
  size_type sVar2;
  reference ppVVar3;
  bool local_25;
  uint local_24;
  uint4 i;
  intb max;
  intb min;
  VarnodeListSymbol *this_local;
  
  (*(((this->super_ValueSymbol).patval)->super_PatternExpression)._vptr_PatternExpression[10])();
  iVar1 = (*(((this->super_ValueSymbol).patval)->super_PatternExpression)._vptr_PatternExpression
            [0xb])();
  local_25 = false;
  if (-1 < extraout_var) {
    sVar2 = std::vector<VarnodeSymbol_*,_std::allocator<VarnodeSymbol_*>_>::size
                      (&this->varnode_table);
    local_25 = CONCAT44(extraout_var_00,iVar1) < sVar2;
  }
  this->tableisfilled = local_25;
  local_24 = 0;
  while( true ) {
    sVar2 = std::vector<VarnodeSymbol_*,_std::allocator<VarnodeSymbol_*>_>::size
                      (&this->varnode_table);
    if (sVar2 <= local_24) break;
    ppVVar3 = std::vector<VarnodeSymbol_*,_std::allocator<VarnodeSymbol_*>_>::operator[]
                        (&this->varnode_table,(ulong)local_24);
    if (*ppVVar3 == (value_type)0x0) {
      this->tableisfilled = false;
    }
    local_24 = local_24 + 1;
  }
  return;
}

Assistant:

void VarnodeListSymbol::checkTableFill(void)

{
  intb min = patval->minValue();
  intb max = patval->maxValue();
  tableisfilled = (min>=0)&&(max<varnode_table.size());
  for(uint4 i=0;i<varnode_table.size();++i) {
    if (varnode_table[i] == (VarnodeSymbol *)0)
      tableisfilled = false;
  }
}